

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ELU_x86_fma::forward_inplace(ELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [32];
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 extraout_var [60];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
    pp_Var3 = this->_vptr_ELU_x86_fma;
    lVar8 = 0;
    auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar42 = ZEXT3264(CONCAT428(0x3f000000,
                                 CONCAT424(0x3f000000,
                                           CONCAT420(0x3f000000,
                                                     CONCAT416(0x3f000000,
                                                               CONCAT412(0x3f000000,
                                                                         CONCAT48(0x3f000000,
                                                                                  0x3f0000003f000000
                                                                                 )))))));
    auVar45 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar47 = ZEXT3264(CONCAT428(0x395e8083,
                                 CONCAT424(0x395e8083,
                                           CONCAT420(0x395e8083,
                                                     CONCAT416(0x395e8083,
                                                               CONCAT412(0x395e8083,
                                                                         CONCAT48(0x395e8083,
                                                                                  0x395e8083395e8083
                                                                                 )))))));
    auVar48 = ZEXT3264(CONCAT428(0x3ab743ce,
                                 CONCAT424(0x3ab743ce,
                                           CONCAT420(0x3ab743ce,
                                                     CONCAT416(0x3ab743ce,
                                                               CONCAT412(0x3ab743ce,
                                                                         CONCAT48(0x3ab743ce,
                                                                                  0x3ab743ce3ab743ce
                                                                                 )))))));
    auVar49 = ZEXT3264(CONCAT428(0x39506967,
                                 CONCAT424(0x39506967,
                                           CONCAT420(0x39506967,
                                                     CONCAT416(0x39506967,
                                                               CONCAT412(0x39506967,
                                                                         CONCAT48(0x39506967,
                                                                                  0x3950696739506967
                                                                                 )))))));
    auVar14 = ZEXT3264(CONCAT428(0x3c088908,
                                 CONCAT424(0x3c088908,
                                           CONCAT420(0x3c088908,
                                                     CONCAT416(0x3c088908,
                                                               CONCAT412(0x3c088908,
                                                                         CONCAT48(0x3c088908,
                                                                                  0x3c0889083c088908
                                                                                 )))))));
    auVar41 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                 CONCAT424(0x3d2aa9c1,
                                           CONCAT420(0x3d2aa9c1,
                                                     CONCAT416(0x3d2aa9c1,
                                                               CONCAT412(0x3d2aa9c1,
                                                                         CONCAT48(0x3d2aa9c1,
                                                                                  0x3d2aa9c13d2aa9c1
                                                                                 )))))));
    auVar44 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                 CONCAT424(0x3e2aaaaa,
                                           CONCAT420(0x3e2aaaaa,
                                                     CONCAT416(0x3e2aaaaa,
                                                               CONCAT412(0x3e2aaaaa,
                                                                         CONCAT48(0x3e2aaaaa,
                                                                                  0x3e2aaaaa3e2aaaaa
                                                                                 )))))));
    auVar36 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar25 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
    auVar31 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
    auVar33 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
    do {
      pauVar11 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
      auVar15._4_4_ = uVar1;
      auVar15._0_4_ = uVar1;
      auVar15._8_4_ = uVar1;
      auVar15._12_4_ = uVar1;
      auVar12._16_4_ = uVar1;
      auVar12._0_16_ = auVar15;
      auVar12._20_4_ = uVar1;
      auVar12._24_4_ = uVar1;
      auVar12._28_4_ = uVar1;
      auVar35 = auVar36._0_16_;
      if ((int)uVar9 < 8) {
        uVar7 = 0;
      }
      else {
        iVar5 = 7;
        do {
          auVar18 = vminps_avx(*pauVar11,auVar34._0_32_);
          auVar21._8_4_ = 0x42b0c0a5;
          auVar21._0_8_ = 0x42b0c0a542b0c0a5;
          auVar21._12_4_ = 0x42b0c0a5;
          auVar21._16_4_ = 0x42b0c0a5;
          auVar21._20_4_ = 0x42b0c0a5;
          auVar21._24_4_ = 0x42b0c0a5;
          auVar21._28_4_ = 0x42b0c0a5;
          auVar18 = vminps_avx(auVar18,auVar21);
          auVar22._8_4_ = 0xc2b0c0a5;
          auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar22._12_4_ = 0xc2b0c0a5;
          auVar22._16_4_ = 0xc2b0c0a5;
          auVar22._20_4_ = 0xc2b0c0a5;
          auVar22._24_4_ = 0xc2b0c0a5;
          auVar22._28_4_ = 0xc2b0c0a5;
          auVar4 = vmaxps_avx(auVar18,auVar22);
          auVar23._8_4_ = 0x3fb8aa3b;
          auVar23._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar23._12_4_ = 0x3fb8aa3b;
          auVar23._16_4_ = 0x3fb8aa3b;
          auVar23._20_4_ = 0x3fb8aa3b;
          auVar23._24_4_ = 0x3fb8aa3b;
          auVar23._28_4_ = 0x3fb8aa3b;
          auVar15 = vfmadd213ps_fma(auVar23,auVar4,auVar42._0_32_);
          auVar17 = vroundps_avx(ZEXT1632(auVar15),1);
          auVar18 = vcmpps_avx(ZEXT1632(auVar15),auVar17,1);
          auVar18 = vandps_avx(auVar45._0_32_,auVar18);
          auVar18 = vsubps_avx(auVar17,auVar18);
          auVar30._8_4_ = 0x3f318000;
          auVar30._0_8_ = 0x3f3180003f318000;
          auVar30._12_4_ = 0x3f318000;
          auVar30._16_4_ = 0x3f318000;
          auVar30._20_4_ = 0x3f318000;
          auVar30._24_4_ = 0x3f318000;
          auVar30._28_4_ = 0x3f318000;
          auVar15 = vfmsub231ps_fma(auVar4,auVar18,auVar30);
          auVar19 = vfmsub231ps_fma(ZEXT1632(auVar15),auVar18,auVar47._0_32_);
          auVar17 = ZEXT1632(auVar19);
          auVar4._28_4_ = 0x3f318000;
          auVar4._0_28_ =
               ZEXT1628(CONCAT412(auVar19._12_4_ * auVar19._12_4_,
                                  CONCAT48(auVar19._8_4_ * auVar19._8_4_,
                                           CONCAT44(auVar19._4_4_ * auVar19._4_4_,
                                                    auVar19._0_4_ * auVar19._0_4_))));
          auVar15 = vfmadd213ps_fma(auVar49._0_32_,auVar17,auVar48._0_32_);
          auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar17,auVar14._0_32_);
          auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar17,auVar41._0_32_);
          auVar17 = ZEXT1632(auVar19);
          auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar17,auVar44._0_32_);
          auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar17,auVar42._0_32_);
          auVar43 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar4,auVar17);
          auVar19._0_4_ = (int)auVar18._0_4_;
          auVar19._4_4_ = (int)auVar18._4_4_;
          auVar19._8_4_ = (int)auVar18._8_4_;
          auVar19._12_4_ = (int)auVar18._12_4_;
          auVar17._16_4_ = (int)auVar18._16_4_;
          auVar17._0_16_ = auVar19;
          auVar17._20_4_ = (int)auVar18._20_4_;
          auVar17._24_4_ = (int)auVar18._24_4_;
          auVar17._28_4_ = (int)auVar18._28_4_;
          auVar19 = vpslld_avx(auVar19,0x17);
          auVar15 = vpslld_avx(auVar17._16_16_,0x17);
          auVar15 = vpaddd_avx(auVar15,auVar35);
          auVar19 = vpaddd_avx(auVar19,auVar35);
          auVar18._16_16_ = auVar15;
          auVar18._0_16_ = auVar19;
          auVar24._0_4_ = auVar45._0_4_ + auVar43._0_4_;
          auVar24._4_4_ = auVar45._4_4_ + auVar43._4_4_;
          auVar24._8_4_ = auVar45._8_4_ + auVar43._8_4_;
          auVar24._12_4_ = auVar45._12_4_ + auVar43._12_4_;
          auVar24._16_4_ = auVar45._16_4_ + 0.0;
          auVar24._20_4_ = auVar45._20_4_ + 0.0;
          auVar24._24_4_ = auVar45._24_4_ + 0.0;
          auVar24._28_4_ = auVar45._28_4_ + 0.0;
          auVar15 = vfmsub213ps_fma(auVar18,auVar24,auVar45._0_32_);
          auVar18 = vmaxps_avx(*pauVar11,auVar34._0_32_);
          auVar15 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar12,auVar18);
          *pauVar11 = ZEXT1632(auVar15);
          pauVar11 = pauVar11 + 1;
          iVar5 = iVar5 + 8;
        } while (iVar5 < (int)uVar9);
        auVar15 = ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var3[-3]));
        auVar46 = ZEXT864(0) << 0x20;
        auVar25 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar31 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar33 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        uVar7 = uVar9 & 0xfffffff8;
      }
      if ((int)(uVar7 | 3) < (int)uVar9) {
        auVar15 = vshufps_avx(auVar15,auVar15,0);
        auVar43._8_4_ = 0x3f000000;
        auVar43._0_8_ = 0x3f0000003f000000;
        auVar43._12_4_ = 0x3f000000;
        uVar6 = uVar7;
        do {
          auVar19 = vminps_avx(auVar46._0_16_,*(undefined1 (*) [16])*pauVar11);
          auVar19 = vminps_avx(auVar19,auVar25._0_16_);
          auVar16 = vmaxps_avx(auVar19,auVar31._0_16_);
          auVar19 = vfmadd213ps_fma(auVar33._0_16_,auVar16,auVar43);
          auVar26._0_4_ = (int)auVar19._0_4_;
          auVar26._4_4_ = (int)auVar19._4_4_;
          auVar26._8_4_ = (int)auVar19._8_4_;
          auVar26._12_4_ = (int)auVar19._12_4_;
          auVar20 = vcvtdq2ps_avx(auVar26);
          auVar19 = vcmpps_avx(auVar19,auVar20,1);
          auVar19 = vandps_avx(auVar19,auVar35);
          auVar19 = vsubps_avx(auVar20,auVar19);
          auVar27._8_4_ = 0x3f318000;
          auVar27._0_8_ = 0x3f3180003f318000;
          auVar27._12_4_ = 0x3f318000;
          auVar20 = vfmsub231ps_fma(auVar16,auVar19,auVar27);
          auVar28._8_4_ = 0x395e8083;
          auVar28._0_8_ = 0x395e8083395e8083;
          auVar28._12_4_ = 0x395e8083;
          auVar16 = vfmsub231ps_fma(auVar20,auVar19,auVar28);
          auVar29._0_4_ = auVar16._0_4_ * auVar16._0_4_;
          auVar29._4_4_ = auVar16._4_4_ * auVar16._4_4_;
          auVar29._8_4_ = auVar16._8_4_ * auVar16._8_4_;
          auVar29._12_4_ = auVar16._12_4_ * auVar16._12_4_;
          auVar32._8_4_ = 0x39506967;
          auVar32._0_8_ = 0x3950696739506967;
          auVar32._12_4_ = 0x39506967;
          auVar37._8_4_ = 0x3ab743ce;
          auVar37._0_8_ = 0x3ab743ce3ab743ce;
          auVar37._12_4_ = 0x3ab743ce;
          auVar20 = vfmadd213ps_fma(auVar32,auVar16,auVar37);
          auVar38._8_4_ = 0x3c088908;
          auVar38._0_8_ = 0x3c0889083c088908;
          auVar38._12_4_ = 0x3c088908;
          auVar20 = vfmadd213ps_fma(auVar20,auVar16,auVar38);
          auVar39._8_4_ = 0x3d2aa9c1;
          auVar39._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar39._12_4_ = 0x3d2aa9c1;
          auVar20 = vfmadd213ps_fma(auVar20,auVar16,auVar39);
          auVar40._8_4_ = 0x3e2aaaaa;
          auVar40._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar40._12_4_ = 0x3e2aaaaa;
          auVar20 = vfmadd213ps_fma(auVar20,auVar16,auVar40);
          auVar20 = vfmadd213ps_fma(auVar20,auVar16,auVar43);
          auVar20 = vfmadd213ps_fma(auVar20,auVar29,auVar16);
          auVar31 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
          auVar16._0_4_ = auVar20._0_4_ + auVar36._0_4_;
          auVar16._4_4_ = auVar20._4_4_ + auVar36._4_4_;
          auVar16._8_4_ = auVar20._8_4_ + auVar36._8_4_;
          auVar16._12_4_ = auVar20._12_4_ + auVar36._12_4_;
          auVar33 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
          auVar20._0_4_ = (int)auVar19._0_4_;
          auVar20._4_4_ = (int)auVar19._4_4_;
          auVar20._8_4_ = (int)auVar19._8_4_;
          auVar20._12_4_ = (int)auVar19._12_4_;
          auVar19 = vpslld_avx(auVar20,0x17);
          auVar19 = vpaddd_avx(auVar19,auVar35);
          auVar20 = vfmsub213ps_fma(auVar19,auVar16,auVar35);
          auVar19 = vmaxps_avx(auVar46._0_16_,*(undefined1 (*) [16])*pauVar11);
          auVar19 = vfmadd213ps_fma(auVar20,auVar15,auVar19);
          *(undefined1 (*) [16])*pauVar11 = auVar19;
          auVar25 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar7 = uVar6 + 4;
          iVar5 = uVar6 + 7;
          uVar6 = uVar7;
        } while (iVar5 < (int)uVar9);
      }
      auVar14 = ZEXT3264(CONCAT428(0x3c088908,
                                   CONCAT424(0x3c088908,
                                             CONCAT420(0x3c088908,
                                                       CONCAT416(0x3c088908,
                                                                 CONCAT412(0x3c088908,
                                                                           CONCAT48(0x3c088908,
                                                                                                                                                                        
                                                  0x3c0889083c088908)))))));
      auVar44 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                   CONCAT424(0x3e2aaaaa,
                                             CONCAT420(0x3e2aaaaa,
                                                       CONCAT416(0x3e2aaaaa,
                                                                 CONCAT412(0x3e2aaaaa,
                                                                           CONCAT48(0x3e2aaaaa,
                                                                                                                                                                        
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar41 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                   CONCAT424(0x3d2aa9c1,
                                             CONCAT420(0x3d2aa9c1,
                                                       CONCAT416(0x3d2aa9c1,
                                                                 CONCAT412(0x3d2aa9c1,
                                                                           CONCAT48(0x3d2aa9c1,
                                                                                                                                                                        
                                                  0x3d2aa9c13d2aa9c1)))))));
      if (uVar9 - uVar7 != 0 && (int)uVar7 <= (int)uVar9) {
        lVar10 = 0;
        do {
          if (*(float *)(*pauVar11 + lVar10 * 4) < 0.0) {
            uVar6 = *(uint *)(&this->field_0xd0 + (long)pp_Var3[-3]);
            auVar13._0_4_ = expf(*(float *)(*pauVar11 + lVar10 * 4));
            auVar13._4_60_ = extraout_var;
            auVar33 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
            auVar31 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            auVar25 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar36 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar44 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar41 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                         CONCAT424(0x3d2aa9c1,
                                                   CONCAT420(0x3d2aa9c1,
                                                             CONCAT416(0x3d2aa9c1,
                                                                       CONCAT412(0x3d2aa9c1,
                                                                                 CONCAT48(0x3d2aa9c1
                                                                                          ,
                                                  0x3d2aa9c13d2aa9c1)))))));
            auVar14 = ZEXT3264(CONCAT428(0x3c088908,
                                         CONCAT424(0x3c088908,
                                                   CONCAT420(0x3c088908,
                                                             CONCAT416(0x3c088908,
                                                                       CONCAT412(0x3c088908,
                                                                                 CONCAT48(0x3c088908
                                                                                          ,
                                                  0x3c0889083c088908)))))));
            auVar49 = ZEXT3264(CONCAT428(0x39506967,
                                         CONCAT424(0x39506967,
                                                   CONCAT420(0x39506967,
                                                             CONCAT416(0x39506967,
                                                                       CONCAT412(0x39506967,
                                                                                 CONCAT48(0x39506967
                                                                                          ,
                                                  0x3950696739506967)))))));
            auVar48 = ZEXT3264(CONCAT428(0x3ab743ce,
                                         CONCAT424(0x3ab743ce,
                                                   CONCAT420(0x3ab743ce,
                                                             CONCAT416(0x3ab743ce,
                                                                       CONCAT412(0x3ab743ce,
                                                                                 CONCAT48(0x3ab743ce
                                                                                          ,
                                                  0x3ab743ce3ab743ce)))))));
            auVar47 = ZEXT3264(CONCAT428(0x395e8083,
                                         CONCAT424(0x395e8083,
                                                   CONCAT420(0x395e8083,
                                                             CONCAT416(0x395e8083,
                                                                       CONCAT412(0x395e8083,
                                                                                 CONCAT48(0x395e8083
                                                                                          ,
                                                  0x395e8083395e8083)))))));
            auVar45 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            auVar42 = ZEXT3264(CONCAT428(0x3f000000,
                                         CONCAT424(0x3f000000,
                                                   CONCAT420(0x3f000000,
                                                             CONCAT416(0x3f000000,
                                                                       CONCAT412(0x3f000000,
                                                                                 CONCAT48(0x3f000000
                                                                                          ,
                                                  0x3f0000003f000000)))))));
            auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar15 = vfmsub213ss_fma(auVar13._0_16_,ZEXT416(uVar6),ZEXT416(uVar6));
            *(int *)(*pauVar11 + lVar10 * 4) = auVar15._0_4_;
          }
          lVar10 = lVar10 + 1;
        } while (uVar9 - uVar7 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return 0;
}

Assistant:

int ELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}